

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O1

cx_string<50UL> * __thiscall
mserialize::cx_strcat<25ul,25ul>
          (cx_string<50UL> *__return_storage_ptr__,mserialize *this,cx_string<25UL> *strings,
          cx_string<25UL> *strings_1)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  size_t size [3];
  char *data [3];
  char buffer [51];
  
  pcVar1 = buffer;
  buffer[0x20] = '\0';
  buffer[0x21] = '\0';
  buffer[0x22] = '\0';
  buffer[0x23] = '\0';
  buffer[0x24] = '\0';
  buffer[0x25] = '\0';
  buffer[0x26] = '\0';
  buffer[0x27] = '\0';
  buffer[0x28] = '\0';
  buffer[0x29] = '\0';
  buffer[0x2a] = '\0';
  buffer[0x2b] = '\0';
  buffer[0x2c] = '\0';
  buffer[0x2d] = '\0';
  buffer[0x2e] = '\0';
  buffer[0x10] = '\0';
  buffer[0x11] = '\0';
  buffer[0x12] = '\0';
  buffer[0x13] = '\0';
  buffer[0x14] = '\0';
  buffer[0x15] = '\0';
  buffer[0x16] = '\0';
  buffer[0x17] = '\0';
  buffer[0x18] = '\0';
  buffer[0x19] = '\0';
  buffer[0x1a] = '\0';
  buffer[0x1b] = '\0';
  buffer[0x1c] = '\0';
  buffer[0x1d] = '\0';
  buffer[0x1e] = '\0';
  buffer[0x1f] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  buffer[0x2f] = '\0';
  buffer[0x30] = '\0';
  buffer[0x31] = '\0';
  data[1] = (char *)this;
  data[2] = strings->_data;
  size[1] = 0x19;
  size[2] = 0x19;
  lVar2 = 1;
  do {
    if (size[lVar2] != 0) {
      uVar3 = 0;
      do {
        pcVar1[uVar3] = data[lVar2][uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar3 < size[lVar2]);
      pcVar1 = pcVar1 + uVar3;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  __return_storage_ptr__->_data[0x32] = '\0';
  *(undefined8 *)__return_storage_ptr__->_data = buffer._0_8_;
  *(undefined8 *)(__return_storage_ptr__->_data + 8) = buffer._8_8_;
  *(undefined8 *)(__return_storage_ptr__->_data + 0x10) = buffer._16_8_;
  *(undefined8 *)(__return_storage_ptr__->_data + 0x18) = buffer._24_8_;
  *(undefined8 *)(__return_storage_ptr__->_data + 0x20) = buffer._32_8_;
  *(ulong *)(__return_storage_ptr__->_data + 0x28) = CONCAT17(buffer[0x2f],buffer._40_7_);
  *(undefined2 *)(__return_storage_ptr__->_data + 0x30) = buffer._48_2_;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}